

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goodbye_inter.cpp
# Opt level: O1

int main(void)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  Am_Object *pAVar5;
  Am_Object aAStack_48 [8];
  Am_Object local_40 [8];
  Am_Object local_38 [8];
  Am_Object local_30 [8];
  Am_Object local_28 [8];
  Am_Object local_20 [8];
  Am_Object local_18 [8];
  
  Am_Initialize();
  Am_Object::Create((char *)local_18);
  uVar1 = Am_Object::Set((ushort)local_18,100,0x32);
  uVar1 = Am_Object::Set(uVar1,0x65,0x32);
  uVar1 = Am_Object::Set(uVar1,0x66,200);
  uVar2 = Am_Object::Set(uVar1,0x67,0x32);
  Am_Object::Create((char *)local_30);
  uVar3 = Am_Object::Set((ushort)local_30,(char *)0xab,0x102012);
  Am_Object::Create((char *)aAStack_48);
  Am_Object::Get_Object((ushort)local_40,(ulong)aAStack_48);
  uVar4 = Am_Object::Set((ushort)local_40,(Am_Method_Wrapper *)0xca,(ulong)quit_method.from_wrapper)
  ;
  Am_Object::Get_Object((ushort)local_38,uVar4);
  pAVar5 = (Am_Object *)Am_Object::Add_Part(uVar3,local_38,1,0);
  Am_Object::Am_Object(local_28,pAVar5);
  pAVar5 = (Am_Object *)Am_Object::Add_Part(uVar2,local_28,1,0);
  Am_Object::Am_Object(local_20,pAVar5);
  Am_Object::Add_Part(&Am_Screen,local_20,1,0);
  Am_Object::~Am_Object(local_20);
  Am_Object::~Am_Object(local_28);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object(aAStack_48);
  Am_Object::~Am_Object(local_30);
  Am_Object::~Am_Object(local_18);
  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}

Assistant:

int main (void)
{
  Am_Initialize ();

  Am_Screen
    .Add_Part( Am_Window.Create ("window")
      .Set( Am_LEFT, 50 )
      .Set( Am_TOP, 50 )
      .Set( Am_WIDTH, 200 )
      .Set( Am_HEIGHT, 50 )
      .Add_Part( Am_Text.Create ("string")
        .Set( Am_TEXT, "Goodbye World!")
        .Add_Part( Am_One_Shot_Interactor.Create()
          .Get_Object( Am_COMMAND )
          .Set( Am_DO_METHOD, quit_method )
          .Get_Owner()
        )
      )
    );

  Am_Main_Event_Loop ();
  Am_Cleanup ();

  return 0;
}